

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deffunc.cpp
# Opt level: O3

void __thiscall ICM::DefFunc::Comp::NumLargeE::NumLargeE(NumLargeE *this)

{
  _Any_data local_28;
  code *local_18;
  code *local_10;
  
  local_28._M_unused._M_object = (void *)0x0;
  local_28._8_8_ = 0;
  local_10 = std::
             _Function_handler<bool_(const_long_&,_const_long_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/Chill-Language[P]ICM/source/runtime/deffunc.cpp:233:62)>
             ::_M_invoke;
  local_18 = std::
             _Function_handler<bool_(const_long_&,_const_long_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/Chill-Language[P]ICM/source/runtime/deffunc.cpp:233:62)>
             ::_M_manager;
  (this->super_NumComp).super_FI._vptr_FuncInitObject = (_func_int **)&PTR_sign_00152578;
  std::function<bool_(const_long_&,_const_long_&)>::function
            (&(this->super_NumComp).fp,(function<bool_(const_long_&,_const_long_&)> *)&local_28);
  if (local_18 != (code *)0x0) {
    (*local_18)(&local_28,&local_28,__destroy_functor);
  }
  (this->super_NumComp).super_FI._vptr_FuncInitObject = (_func_int **)&PTR_sign_00152640;
  return;
}

Assistant:

NumLargeL() : NumComp([](const N &n1, const N &n2) { return n1 > n2; }) {}